

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
          (parser<pstore::exchange::import_ns::callbacks> *this,callbacks *callbacks,
          extensions extensions)

{
  stack<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>_>
  *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  _Var3;
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  local_38;
  
  _Var3._M_head_impl =
       (singleton_storage<pstore::exchange::import_ns::callbacks> *)operator_new(0x68);
  (this->singletons_)._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = _Var3._M_head_impl;
  this_00 = &this->stack_;
  std::
  stack<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>>
  ::
  stack<std::deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>,void>
            (this_00);
  std::error_code::error_code(&this->error_);
  (this->callbacks_).context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (callbacks->context_).
           super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (callbacks->context_).
           super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (callbacks->context_).
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->callbacks_).context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->callbacks_).context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (callbacks->context_).
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->extensions_ = extensions;
  (this->string_)._M_dataplus._M_p = (pointer)&(this->string_).field_2;
  (this->string_)._M_string_length = 0;
  (this->string_).field_2._M_local_buf[0] = '\0';
  (this->coordinate_).column = 1;
  (this->coordinate_).row = 1;
  local_38._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (matcher<pstore::exchange::import_ns::callbacks> *)
       (this->singletons_)._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       .
       super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       ._M_head_impl;
  *(undefined4 *)
   ((long)&((singleton_storage<pstore::exchange::import_ns::callbacks> *)
           local_38._M_t.
           super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
           ._M_head_impl)->eof + 8) = 2;
  *(undefined ***)
   &((singleton_storage<pstore::exchange::import_ns::callbacks> *)
    local_38._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
    ._M_head_impl)->eof = &PTR__matcher_002271d0;
  local_38._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
  ._M_head_impl.delete_ =
       (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
        )(deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>)0x0;
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
  ::
  emplace_back<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>
            ((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
              *)this_00,&local_38);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ::~unique_ptr(&local_38);
  _Var3._M_head_impl =
       (this->singletons_)._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       .
       super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       ._M_head_impl;
  local_38._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (matcher<pstore::exchange::import_ns::callbacks> *)&(_Var3._M_head_impl)->trailing_ws;
  *(undefined4 *)((long)&(_Var3._M_head_impl)->trailing_ws + 8) = 2;
  ((_Var3._M_head_impl)->trailing_ws).__align =
       (anon_struct_8_0_00000001_for___align)&PTR__matcher_00227220;
  local_38._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
  ._M_head_impl.delete_ =
       (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
        )(deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>)0x0;
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
  ::
  emplace_back<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>
            ((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
              *)this_00,&local_38);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ::~unique_ptr(&local_38);
  _Var3._M_head_impl =
       (this->singletons_)._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
       .
       super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
       ._M_head_impl;
  local_38._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)&(_Var3._M_head_impl)->root;
  *(undefined4 *)((long)&(_Var3._M_head_impl)->root + 8) = 2;
  ((_Var3._M_head_impl)->root).__align =
       (anon_struct_8_0_00000001_for___align)&PTR__matcher_00227260;
  *(undefined1 *)((long)&(_Var3._M_head_impl)->root + 0xc) = 0;
  local_38._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
  ._M_head_impl.delete_ =
       (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>,_false>
        )(deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>)0x0;
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
  ::
  emplace_back<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>
            ((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>>>>>
              *)this_00,&local_38);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ::~unique_ptr(&local_38);
  return;
}

Assistant:

parser<Callbacks>::parser (Callbacks callbacks, extensions const extensions)
                : callbacks_ (std::move (callbacks))
                , extensions_{extensions} {

            using mpointer = typename matcher::pointer;
            using deleter = typename mpointer::deleter_type;
            // The EOF matcher is placed at the bottom of the stack to ensure that the input JSON
            // ends after a single top-level object.
            stack_.push (mpointer (new (&singletons_->eof) details::eof_matcher<Callbacks>{},
                                   deleter{false}));
            // We permit whitespace after the top-level object.
            stack_.push (mpointer (new (&singletons_->trailing_ws)
                                       details::whitespace_matcher<Callbacks>{},
                                   deleter{false}));
            stack_.push (this->make_root_matcher ());
        }